

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 VmHttpProcessFirstLine(SyString *pRequest,sxi32 *pMethod,SyhttpUri *pUri,sxi32 *pProto)

{
  uint uVar1;
  sxi32 sVar2;
  char *pcVar3;
  ushort **ppuVar4;
  bool bVar5;
  uint local_64;
  int local_60;
  sxu32 i;
  sxi32 rc;
  sxu32 nLen;
  SyString sLine;
  char *zPtr;
  char *zEnd;
  char *zIn;
  sxi32 *pProto_local;
  SyhttpUri *pUri_local;
  sxi32 *pMethod_local;
  SyString *pRequest_local;
  
  pRequest_local._4_4_ = VmGetNextLine(pRequest,(SyString *)&rc);
  if (pRequest_local._4_4_ == 0) {
    if ((uint)sLine.zString == 0) {
      pRequest_local._4_4_ = -3;
    }
    else {
      zEnd = _rc;
      pcVar3 = _rc + (uint)sLine.zString;
      while( true ) {
        bVar5 = false;
        if ((zEnd < pcVar3) && (bVar5 = false, (byte)*zEnd < 0xc0)) {
          ppuVar4 = __ctype_b_loc();
          bVar5 = ((*ppuVar4)[(int)*zEnd] & 0x2000) != 0;
        }
        if (!bVar5) break;
        zEnd = zEnd + 1;
      }
      sLine._8_8_ = zEnd;
      while( true ) {
        bVar5 = false;
        if (zEnd < pcVar3) {
          ppuVar4 = __ctype_b_loc();
          bVar5 = ((*ppuVar4)[(int)*zEnd] & 0x2000) == 0;
        }
        if (!bVar5) break;
        zEnd = zEnd + 1;
      }
      *pMethod = 5;
      if ((ulong)sLine._8_8_ < zEnd) {
        uVar1 = sLine.nByte;
        for (local_64 = 0; local_64 < 4; local_64 = local_64 + 1) {
          sVar2 = SyStrnicmp(VmHttpProcessFirstLine::azMethods[local_64],(char *)sLine._8_8_,
                             (int)zEnd - uVar1);
          if (sVar2 == 0) {
            *pMethod = VmHttpProcessFirstLine::aMethods[local_64];
            break;
          }
        }
      }
      while( true ) {
        bVar5 = false;
        if ((zEnd < pcVar3) && (bVar5 = false, (byte)*zEnd < 0xc0)) {
          ppuVar4 = __ctype_b_loc();
          bVar5 = ((*ppuVar4)[(int)*zEnd] & 0x2000) != 0;
        }
        if (!bVar5) break;
        zEnd = zEnd + 1;
      }
      sLine._8_8_ = zEnd;
      while( true ) {
        bVar5 = false;
        if (zEnd < pcVar3) {
          ppuVar4 = __ctype_b_loc();
          bVar5 = ((*ppuVar4)[(int)*zEnd] & 0x2000) == 0;
        }
        if (!bVar5) break;
        zEnd = zEnd + 1;
      }
      if ((ulong)sLine._8_8_ < zEnd) {
        VmHttpSplitURI(pUri,(char *)sLine._8_8_,(int)zEnd - sLine.nByte);
      }
      while( true ) {
        bVar5 = false;
        if ((zEnd < pcVar3) && (bVar5 = false, (byte)*zEnd < 0xc0)) {
          ppuVar4 = __ctype_b_loc();
          bVar5 = ((*ppuVar4)[(int)*zEnd] & 0x2000) != 0;
        }
        if (!bVar5) break;
        zEnd = zEnd + 1;
      }
      sLine._8_8_ = zEnd;
      while( true ) {
        bVar5 = false;
        if (zEnd < pcVar3) {
          ppuVar4 = __ctype_b_loc();
          bVar5 = ((*ppuVar4)[(int)*zEnd] & 0x2000) == 0;
        }
        if (!bVar5) break;
        zEnd = zEnd + 1;
      }
      *pProto = 2;
      local_60 = 1;
      if ((ulong)sLine._8_8_ < zEnd) {
        local_60 = SyStrnicmp((char *)sLine._8_8_,"http/1.0",(int)zEnd - sLine.nByte);
      }
      if (local_60 == 0) {
        *pProto = 1;
      }
      pRequest_local._4_4_ = 0;
    }
  }
  return pRequest_local._4_4_;
}

Assistant:

static sxi32 VmHttpProcessFirstLine(
	 SyString *pRequest, /* Raw HTTP request */
	 sxi32 *pMethod,     /* OUT: HTTP method */
	 SyhttpUri *pUri,    /* OUT: Parse of the URI */
	 sxi32 *pProto       /* OUT: HTTP protocol */
	 )
 {
	 static const char *azMethods[] = { "get", "post", "head", "put"};
	 static const sxi32 aMethods[]  = { HTTP_METHOD_GET, HTTP_METHOD_POST, HTTP_METHOD_HEAD, HTTP_METHOD_PUT};
	 const char *zIn, *zEnd, *zPtr;
	 SyString sLine;
	 sxu32 nLen;
	 sxi32 rc;
	 /* Extract the first line and update the pointer */
	 rc = VmGetNextLine(pRequest, &sLine);
	 if( rc != SXRET_OK ){
		 return rc;
	 }
	 if ( sLine.nByte < 1 ){
		 /* Empty HTTP request */
		 return SXERR_EMPTY;
	 }
	 /* Delimit the line and ignore trailing and leading white spaces */
	 zIn = sLine.zString;
	 zEnd = &zIn[sLine.nByte];
	 while( zIn < zEnd && (unsigned char)zIn[0] < 0xc0 && SyisSpace(zIn[0]) ){
		 zIn++;
	 }
	 /* Extract the HTTP method */
	 zPtr = zIn;
	 while( zIn < zEnd && !SyisSpace(zIn[0]) ){
		 zIn++;
	 }
	 *pMethod = HTTP_METHOD_OTHR;
	 if( zIn > zPtr ){
		 sxu32 i;
		 nLen = (sxu32)(zIn-zPtr);
		 for( i = 0 ; i < SX_ARRAYSIZE(azMethods) ; ++i ){
			 if( SyStrnicmp(azMethods[i], zPtr, nLen) == 0 ){
				 *pMethod = aMethods[i];
				 break;
			 }
		 }
	 }
	 /* Jump trailing white spaces */
	 while( zIn < zEnd && (unsigned char)zIn[0] < 0xc0 && SyisSpace(zIn[0]) ){
		 zIn++;
	 }
	  /* Extract the request URI */
	 zPtr = zIn;
	 while( zIn < zEnd && !SyisSpace(zIn[0]) ){
		 zIn++;
	 } 
	 if( zIn > zPtr ){
		 nLen = (sxu32)(zIn-zPtr);
		 /* Split raw URI to it's fields */
		 VmHttpSplitURI(pUri, zPtr, nLen);
	 }
	 /* Jump trailing white spaces */
	 while( zIn < zEnd && (unsigned char)zIn[0] < 0xc0 && SyisSpace(zIn[0]) ){
		 zIn++;
	 }
	 /* Extract the HTTP version */
	 zPtr = zIn;
	 while( zIn < zEnd && !SyisSpace(zIn[0]) ){
		 zIn++;
	 }
	 *pProto = HTTP_PROTO_11; /* HTTP/1.1 */
	 rc = 1;
	 if( zIn > zPtr ){
		 rc = SyStrnicmp(zPtr, "http/1.0", (sxu32)(zIn-zPtr));
	 }
	 if( !rc ){
		 *pProto = HTTP_PROTO_10; /* HTTP/1.0 */
	 }
	 return SXRET_OK;
 }